

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O2

uint32_t * pack17_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 - base;
  *out = (in[1] - base) * 0x20000 | uVar1 - base;
  uVar2 = in[1] - base >> 0xf;
  out[1] = uVar2;
  uVar2 = (in[2] - base) * 4 | uVar2;
  out[1] = uVar2;
  out[1] = (in[3] - base) * 0x80000 | uVar2;
  uVar2 = in[3] - base >> 0xd;
  out[2] = uVar2;
  uVar2 = (in[4] - base) * 0x10 | uVar2;
  out[2] = uVar2;
  out[2] = (in[5] - base) * 0x200000 | uVar2;
  uVar2 = in[5] - base >> 0xb;
  out[3] = uVar2;
  uVar2 = (in[6] - base) * 0x40 | uVar2;
  out[3] = uVar2;
  out[3] = (in[7] - base) * 0x800000 | uVar2;
  uVar2 = in[7] - base >> 9;
  out[4] = uVar2;
  uVar2 = (in[8] - base) * 0x100 | uVar2;
  out[4] = uVar2;
  out[4] = (in[9] - base) * 0x2000000 | uVar2;
  uVar2 = in[9] - base >> 7;
  out[5] = uVar2;
  uVar2 = (in[10] - base) * 0x400 | uVar2;
  out[5] = uVar2;
  out[5] = (in[0xb] - base) * 0x8000000 | uVar2;
  uVar2 = in[0xb] - base >> 5;
  out[6] = uVar2;
  uVar2 = (in[0xc] - base) * 0x1000 | uVar2;
  out[6] = uVar2;
  out[6] = (in[0xd] - base) * 0x20000000 | uVar2;
  uVar2 = in[0xd] - base >> 3;
  out[7] = uVar2;
  uVar2 = (in[0xe] - base) * 0x4000 | uVar2;
  out[7] = uVar2;
  out[7] = (in[0xf] - base) * -0x80000000 | uVar2;
  out[8] = in[0xf] - base >> 1;
  return out + 9;
}

Assistant:

uint32_t * pack17_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  17 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 17  -  2 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  2 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  19 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 17  -  4 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  4 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  21 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 17  -  6 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  6 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  23 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 17  -  8 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  8 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  25 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 17  -  10 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  10 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  27 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 17  -  12 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  12 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  29 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 17  -  14 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  14 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  31 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 17  -  16 );
    ++in;

    return out + 1;
}